

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Accuracy::Texture2DMipmapCase::Texture2DMipmapCase
          (Texture2DMipmapCase *this,TestContext *testCtx,RenderContext *renderCtx,
          ContextInfo *renderCtxInfo,char *name,char *desc,CoordType coordType,deUint32 minFilter,
          deUint32 wrapS,deUint32 wrapT,deUint32 format,deUint32 dataType,int width,int height)

{
  TestLog *log;
  char *desc_local;
  char *name_local;
  ContextInfo *renderCtxInfo_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  Texture2DMipmapCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,NODETYPE_ACCURACY,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DMipmapCase_015915f0;
  this->m_renderCtx = renderCtx;
  this->m_renderCtxInfo = renderCtxInfo;
  this->m_coordType = coordType;
  this->m_minFilter = minFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_width = width;
  this->m_height = height;
  this->m_texture = (Texture2D *)0x0;
  log = tcu::TestContext::getLog(testCtx);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  return;
}

Assistant:

Texture2DMipmapCase::Texture2DMipmapCase (tcu::TestContext&			testCtx,
										  glu::RenderContext&		renderCtx,
										  const glu::ContextInfo&	renderCtxInfo,
										  const char*				name,
										  const char*				desc,
										  CoordType					coordType,
										  deUint32					minFilter,
										  deUint32					wrapS,
										  deUint32					wrapT,
										  deUint32					format,
										  deUint32					dataType,
										  int						width,
										  int						height)
	: TestCase			(testCtx, tcu::NODETYPE_ACCURACY, name, desc)
	, m_renderCtx		(renderCtx)
	, m_renderCtxInfo	(renderCtxInfo)
	, m_coordType		(coordType)
	, m_minFilter		(minFilter)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_format			(format)
	, m_dataType		(dataType)
	, m_width			(width)
	, m_height			(height)
	, m_texture			(DE_NULL)
	, m_renderer		(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
{
}